

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDataBlock.cpp
# Opt level: O1

vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> *
ZXing::DataMatrix::GetDataBlocks
          (vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
           *__return_storage_ptr__,ByteArray *rawCodewords,Version *version,bool fix259)

{
  pointer puVar1;
  int iVar2;
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> *pvVar3;
  long lVar4;
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> *pvVar5;
  int iVar6;
  undefined7 in_register_00000009;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  anon_struct_8_2_fb5c1508 *paVar17;
  long lVar18;
  value_type_conflict local_8e;
  allocator_type local_8d;
  undefined4 local_8c;
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> local_88;
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> *local_70;
  size_type local_68;
  ByteArray *local_60;
  long local_58;
  DataBlock local_50;
  
  local_8c = (undefined4)CONCAT71(in_register_00000009,fix259);
  local_68 = (long)(version->ecBlocks).blocks[1].count + (long)(version->ecBlocks).blocks[0].count;
  local_88.
  super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70 = __return_storage_ptr__;
  local_60 = rawCodewords;
  std::vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::reserve
            (&local_88,local_68);
  paVar17 = (version->ecBlocks).blocks;
  lVar4 = 0x18;
  do {
    local_58 = lVar4;
    if (0 < paVar17->count) {
      iVar8 = 0;
      do {
        local_50.numDataCodewords = paVar17->dataCodewords;
        local_8e = '\0';
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_50.codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                   (long)(version->ecBlocks).codewordsPerBlock + (long)local_50.numDataCodewords,
                   &local_8e,&local_8d);
        std::vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::
        emplace_back<ZXing::DataMatrix::DataBlock>(&local_88,&local_50);
        if (local_50.codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.codewords.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50.codewords.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.codewords.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 < paVar17->count);
    }
    pvVar3 = local_70;
    paVar17 = (anon_struct_8_2_fb5c1508 *)((long)((version->ecBlocks).blocks + -2) + local_58);
    lVar4 = local_58 + 8;
  } while (lVar4 != 0x28);
  iVar6 = *(int *)&((local_88.
                     super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                     ._M_impl.super__Vector_impl_data._M_start)->codewords).
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
          *(int *)&((local_88.
                     super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                     ._M_impl.super__Vector_impl_data._M_start)->codewords).
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  iVar8 = (version->ecBlocks).codewordsPerBlock;
  iVar10 = iVar6 - iVar8;
  uVar7 = iVar10 - 1;
  uVar12 = 0;
  uVar9 = (uint)local_68;
  if (1 < iVar10) {
    uVar13 = 1;
    if (1 < (int)uVar7) {
      uVar13 = (ulong)uVar7;
    }
    uVar15 = 0;
    uVar12 = 0;
    do {
      if (0 < (int)uVar9) {
        lVar16 = (long)(int)uVar12;
        lVar18 = 8;
        lVar4 = 0;
        do {
          puVar1 = (local_60->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar16;
          lVar16 = lVar16 + 1;
          *(uchar *)(*(long *)((long)&(local_88.
                                       super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->numDataCodewords
                              + lVar18) + uVar15) = *puVar1;
          lVar4 = lVar4 + -1;
          lVar18 = lVar18 + 0x20;
        } while (-lVar4 != (local_68 & 0xffffffff));
        uVar12 = (ulong)(uint)((int)uVar12 - (int)lVar4);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar13);
  }
  iVar2 = version->symbolHeight;
  uVar14 = 8;
  if (iVar2 != 0x90) {
    uVar14 = uVar9;
  }
  if (0 < (int)uVar14) {
    uVar12 = (ulong)(int)uVar12;
    lVar4 = 0;
    do {
      puVar1 = (local_60->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + uVar12;
      uVar12 = uVar12 + 1;
      *(uchar *)(*(long *)((long)&((local_88.
                                    super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->codewords).
                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar4) +
                (long)(int)uVar7) = *puVar1;
      lVar4 = lVar4 + 0x20;
    } while ((ulong)uVar14 << 5 != lVar4);
  }
  iVar11 = (int)uVar12;
  if (0 < iVar8) {
    do {
      if (0 < (int)uVar9) {
        lVar4 = 0;
        do {
          uVar7 = (uint)lVar4;
          if ((iVar2 == 0x90 & (byte)local_8c) != 0) {
            uVar7 = (uVar7 + 8) % uVar9;
          }
          local_88.
          super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
          ._M_impl.super__Vector_impl_data._M_start[(int)uVar7].codewords.
          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[(int)(iVar10 - (uint)(7 < (int)uVar7 && iVar2 == 0x90))]
               = (local_60->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4 + (int)uVar12];
          lVar4 = lVar4 + 1;
        } while (uVar9 != (uint)lVar4);
        uVar12 = (ulong)((int)uVar12 + (uint)lVar4);
      }
      iVar11 = (int)uVar12;
      iVar10 = iVar10 + 1;
    } while (iVar10 < iVar6);
  }
  pvVar5 = local_70;
  if (iVar11 == *(int *)&(local_60->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                *(int *)&(local_60->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start) {
    (local_70->
    super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>)
    ._M_impl.super__Vector_impl_data._M_start =
         local_88.
         super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (local_70->
    super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>)
    ._M_impl.super__Vector_impl_data._M_finish =
         local_88.
         super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (local_70->
    super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>)
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_88.
         super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar5 = &local_88;
  }
  (pvVar5->
  super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar5->
  super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar5->
  super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::~vector
            (&local_88);
  return pvVar3;
}

Assistant:

std::vector<DataBlock> GetDataBlocks(const ByteArray& rawCodewords, const Version& version, bool fix259)
{
	// First count the total number of data blocks
	// Now establish DataBlocks of the appropriate size and number of data codewords
	auto& ecBlocks = version.ecBlocks;
	const int numResultBlocks = ecBlocks.numBlocks();
	std::vector<DataBlock> result;
	result.reserve(numResultBlocks);
	for (auto& ecBlock : ecBlocks.blocks)
		for (int i = 0; i < ecBlock.count; i++)
			result.push_back({ecBlock.dataCodewords, ByteArray(ecBlocks.codewordsPerBlock + ecBlock.dataCodewords)});

	// All blocks have the same amount of data, except that the last n
	// (where n may be 0) have 1 less byte. Figure out where these start.
	// TODO(bbrown): There is only one case where there is a difference for Data Matrix for size 144
	const int numCodewords = Size(result[0].codewords);
	const int numDataCodewords = numCodewords - ecBlocks.codewordsPerBlock;

	// The last elements of result may be 1 element shorter for 144 matrix
	// first fill out as many elements as all of them have minus 1
	int rawCodewordsOffset = 0;
	for (int i = 0; i < numDataCodewords - 1; i++)
		for (int j = 0; j < numResultBlocks; j++)
			result[j].codewords[i] = rawCodewords[rawCodewordsOffset++];

	// Fill out the last data block in the longer ones
	const bool size144x144 = version.symbolHeight == 144;
	const int numLongerBlocks = size144x144 ? 8 : numResultBlocks;
	for (int j = 0; j < numLongerBlocks; j++)
		result[j].codewords[numDataCodewords - 1] = rawCodewords[rawCodewordsOffset++];

	// Now add in error correction blocks
	for (int i = numDataCodewords; i < numCodewords; i++) {
		for (int j = 0; j < numResultBlocks; j++) {
			int jOffset = size144x144 && fix259 ? (j + 8) % numResultBlocks : j;
			int iOffset = size144x144 && jOffset > 7 ? i - 1 : i;
			result[jOffset].codewords[iOffset] = rawCodewords[rawCodewordsOffset++];
		}
	}

	if (rawCodewordsOffset != Size(rawCodewords))
		return {};

	return result;
}